

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBSTest_BERElementTest_Test::TestBody(CBSTest_BERElementTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *in_R9;
  Span<const_unsigned_char> span;
  AssertHelper local_2c8;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_6;
  Message local_2a0;
  Span<const_unsigned_char> local_298;
  Bytes local_288;
  Span<const_unsigned_char> local_278;
  Bytes local_268;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_5;
  Message local_240;
  uint local_234;
  size_t local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_4;
  Message local_210;
  size_type local_208;
  size_t local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  Message local_1e0;
  size_type local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  Message local_1b8;
  uint local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_1;
  Message local_190;
  uint local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  int local_120;
  int ok;
  int indefinite;
  int ber_found;
  size_t header_len;
  undefined1 local_108 [4];
  CBS_ASN1_TAG tag;
  CBS out;
  undefined1 local_e8 [8];
  CBS in;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8 [3];
  allocator<char> local_89;
  string local_88;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_bytes;
  ScopedTrace gtest_trace_810;
  BERTest *test;
  BERTest *__end1;
  BERTest *__begin1;
  BERTest (*__range1) [18];
  CBSTest_BERElementTest_Test *this_local;
  
  __end1 = (BERTest *)&(anonymous_namespace)::kBERTests;
  while( true ) {
    if (__end1 == (BERTest *)
                  &testing::internal::
                   TestFactoryImpl<(anonymous_namespace)::CBSTest_ImplicitString_Test>::vtable) {
      return;
    }
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)
               ((long)&in_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x32a,__end1->in_hex);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
    pcVar2 = __end1->in_hex;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar2,&local_89);
    local_61 = DecodeHex((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &gtest_ar_.message_,&local_88);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_60,&local_61,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_d0,(internal *)local_60,
                 (AssertionResult *)"DecodeHex(&in_bytes, test.in_hex)","false","true",(char *)in_R9
                );
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x32d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b0,local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      testing::Message::~Message(local_a8);
    }
    in.len._5_3_ = 0;
    in.len._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (in.len._4_4_ == 0) {
      bssl::Span<unsigned_char_const>::
      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<unsigned_char_const> *)&out.len,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
      cbs_st::cbs_st((cbs_st *)local_e8,stack0xffffffffffffff08);
      in_R9 = &local_120;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           CBS_get_any_ber_asn1_element
                     ((CBS *)local_e8,(CBS *)local_108,(CBS_ASN1_TAG *)((long)&header_len + 4),
                      (size_t *)&indefinite,&ok,in_R9);
      local_139 = (gtest_ar__1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_ == 1) == (bool)(__end1->ok & 1U);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_138,&local_139,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_138,
                   (AssertionResult *)"(ok == 1) == test.ok","false","true",(char *)in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x336,pcVar2);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_148);
      }
      in.len._5_3_ = 0;
      in.len._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
      if (in.len._4_4_ == 0) {
        if ((__end1->ok & 1U) == 0) {
          in.len._4_4_ = 3;
        }
        else {
          local_184 = __end1->ber_found & 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_180,"test.ber_found ? 1 : 0","ber_found",(int *)&local_184,
                     &ok);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x33b,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_190);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_190);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          local_1ac = __end1->indefinite & 1;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1a8,"test.indefinite ? 1 : 0","indefinite",(int *)&local_1ac,
                     &local_120);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
          if (!bVar1) {
            testing::Message::Message(&local_1b8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x33c,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_1b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_1b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
          local_1d8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &gtest_ar_.message_);
          testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                    ((internal *)local_1d0,"header_len","in_bytes.size()",
                     (unsigned_long *)&indefinite,&local_1d8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
          if (!bVar1) {
            testing::Message::Message(&local_1e0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x33d,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_1e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_1e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
          local_200 = CBS_len((CBS *)local_108);
          local_208 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &gtest_ar_.message_);
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_1f8,"CBS_len(&out)","in_bytes.size()",&local_200,&local_208);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
          if (!bVar1) {
            testing::Message::Message(&local_210);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x33e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_210);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_210);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
          local_230 = CBS_len((CBS *)local_e8);
          local_234 = 0;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                    ((EqHelper *)local_228,"CBS_len(&in)","0u",&local_230,&local_234);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
          if (!bVar1) {
            testing::Message::Message(&local_240);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x33f,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_240);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_240);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
          span = cbs_st::operator_cast_to_Span((cbs_st *)local_108);
          local_278 = span;
          Bytes::Bytes(&local_268,span);
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_298,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
          Bytes::Bytes(&local_288,local_298);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_258,"Bytes(out)","Bytes(in_bytes)",&local_268,&local_288);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
          if (!bVar1) {
            testing::Message::Message(&local_2a0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x340,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_2a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_2a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((EqHelper *)local_2b8,"tag","test.tag",(uint *)((long)&header_len + 4),
                     &__end1->tag);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
          if (!bVar1) {
            testing::Message::Message(&local_2c0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x341,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
            testing::internal::AssertHelper::~AssertHelper(&local_2c8);
            testing::Message::~Message(&local_2c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
          in.len._4_4_ = 0;
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&in_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if ((in.len._4_4_ != 0) && (in.len._4_4_ == 1)) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST(CBSTest, BERElementTest) {
  for (const auto &test : kBERTests) {
    SCOPED_TRACE(test.in_hex);

    std::vector<uint8_t> in_bytes;
    ASSERT_TRUE(DecodeHex(&in_bytes, test.in_hex));
    CBS in(in_bytes);
    CBS out;
    CBS_ASN1_TAG tag;
    size_t header_len;
    int ber_found;
    int indefinite;
    int ok = CBS_get_any_ber_asn1_element(&in, &out, &tag, &header_len,
                                          &ber_found, &indefinite);
    ASSERT_TRUE((ok == 1) == test.ok);
    if (!test.ok) {
      continue;
    }

    EXPECT_EQ(test.ber_found ? 1 : 0, ber_found);
    EXPECT_EQ(test.indefinite ? 1 : 0, indefinite);
    EXPECT_LE(header_len, in_bytes.size());
    EXPECT_EQ(CBS_len(&out), in_bytes.size());
    EXPECT_EQ(CBS_len(&in), 0u);
    EXPECT_EQ(Bytes(out), Bytes(in_bytes));
    EXPECT_EQ(tag, test.tag);
  }
}